

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

_Bool uit_progress(mdl_t *mdl,uint32_t it,double obj)

{
  uint uVar1;
  opt_t *poVar2;
  double *pdVar3;
  uint32_t i;
  uint uVar4;
  ulong uVar5;
  uint64_t uVar6;
  bool bVar7;
  char *msg;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  double te;
  double se;
  tms_t now;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  timeval local_30;
  
  local_40 = obj;
  tag_eval(mdl,&local_50,&local_38);
  if (mdl->nftr == 0) {
    lVar8 = 0;
  }
  else {
    uVar6 = 0;
    lVar8 = 0;
    do {
      lVar8 = lVar8 + (ulong)(mdl->theta[uVar6] != 0.0);
      uVar6 = uVar6 + 1;
    } while (mdl->nftr != uVar6);
  }
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  local_48 = ((double)CONCAT44(local_30.tv_usec._4_4_,(undefined4)local_30.tv_usec) * 1e-06 +
             (double)CONCAT44(local_30.tv_sec._4_4_,(undefined4)local_30.tv_sec)) -
             ((double)(mdl->timer).tv_usec * 1e-06 + (double)(mdl->timer).tv_sec);
  mdl->total = mdl->total + local_48;
  *(undefined4 *)&(mdl->timer).tv_sec = (undefined4)local_30.tv_sec;
  *(undefined4 *)((long)&(mdl->timer).tv_sec + 4) = local_30.tv_sec._4_4_;
  *(undefined4 *)&(mdl->timer).tv_usec = (undefined4)local_30.tv_usec;
  *(undefined4 *)((long)&(mdl->timer).tv_usec + 4) = local_30.tv_usec._4_4_;
  info("  [%4u]",it);
  msg = " obj=NA";
  if (0.0 <= local_40) {
    msg = " obj=%-10.2f";
  }
  bVar7 = true;
  info(msg);
  info(" act=%-8lu",lVar8);
  info(" err=%5.2f%%/%5.2f%%",SUB84(local_50,0),local_38);
  info(" time=%.2fs/%.2fs",SUB84(local_48,0),mdl->total);
  info("\n");
  poVar2 = mdl->opt;
  uVar1 = poVar2->stopwin;
  if ((ulong)uVar1 != 0) {
    pdVar3 = mdl->werr;
    uVar4 = mdl->wpos;
    pdVar3[uVar4] = local_50;
    mdl->wpos = (uVar4 + 1) % uVar1;
    uVar4 = mdl->wcnt + 1;
    mdl->wcnt = uVar4;
    if (uVar1 <= uVar4) {
      uVar9 = 0;
      uVar10 = 0x40690000;
      uVar5 = 0;
      dVar11 = -100.0;
      do {
        dVar12 = pdVar3[uVar5];
        if (dVar12 <= (double)CONCAT44(uVar10,uVar9)) {
          uVar9 = SUB84(dVar12,0);
          uVar10 = (undefined4)((ulong)dVar12 >> 0x20);
        }
        if (dVar12 <= dVar11) {
          dVar12 = dVar11;
        }
        uVar5 = uVar5 + 1;
        dVar11 = dVar12;
      } while (uVar1 != uVar5);
      bVar7 = poVar2->stopeps <= dVar12 - (double)CONCAT44(uVar10,uVar9);
    }
  }
  return (_Bool)((uit_stop ^ 1U) & bVar7);
}

Assistant:

bool uit_progress(mdl_t *mdl, uint32_t it, double obj) {
	// First we just compute the error rate on devel or train data
	double te, se;
	tag_eval(mdl, &te, &se);
	// Next, we compute the number of active features
	uint64_t act = 0;
	for (uint64_t f = 0; f < mdl->nftr; f++)
		if (mdl->theta[f] != 0.0)
			act++;
	// Compute timings. As some training algorithms are multi-threaded, we
	// cannot use ansi/c function and must rely on posix one to sum time
	// spent in main thread and in child ones.
	tms_t now; gettimeofday(&now, NULL);
	double tm = (now.tv_sec        + (double)now.tv_usec        * 1.0e-6)
	          - (mdl->timer.tv_sec + (double)mdl->timer.tv_usec * 1.0e-6);
	mdl->total += tm;
	mdl->timer  = now;
	// And display progress report
	info("  [%4"PRIu32"]", it);
	info(obj >= 0.0 ? " obj=%-10.2f" : " obj=NA", obj);
	info(" act=%-8"PRIu64, act);
	info(" err=%5.2f%%/%5.2f%%", te, se);
	info(" time=%.2fs/%.2fs", tm, mdl->total);
	info("\n");
	// If requested, check the error rate stoping criterion. We check if the
	// error rate is stable enought over a few iterations.
	bool res = true;
	if (mdl->opt->stopwin != 0) {
		mdl->werr[mdl->wpos] = te;
		mdl->wpos = (mdl->wpos + 1) % mdl->opt->stopwin;
		mdl->wcnt++;
		if (mdl->wcnt >= mdl->opt->stopwin) {
			double emin = 200.0, emax = -100.0;
			for (uint32_t i = 0; i < mdl->opt->stopwin; i++) {
				emin = min(emin, mdl->werr[i]);
				emax = max(emax, mdl->werr[i]);
			}
			if (emax - emin < mdl->opt->stopeps)
				res = false;
		}
	}
	// And return
	if (uit_stop)
		return false;
	return res;
}